

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luma_quantizer.cpp
# Opt level: O1

void __thiscall LumaQuantizer::setMappingJNDHDRVDP(LumaQuantizer *this)

{
  uint uVar1;
  float *pfVar2;
  float *pfVar3;
  long lVar4;
  
  pfVar3 = ptf_jnd_hdrvdp_12bit;
  if (this->m_bitdepth == 0xb) {
    pfVar3 = ptf_jnd_hdrvdp_11bit;
  }
  pfVar2 = ptf_jnd_hdrvdp_10bit;
  if (this->m_bitdepth != 10) {
    pfVar2 = pfVar3;
  }
  uVar1 = this->m_maxVal;
  pfVar3 = this->m_mapping;
  lVar4 = 0;
  do {
    pfVar3[lVar4] = pfVar2[lVar4];
    lVar4 = lVar4 + 1;
  } while ((ulong)uVar1 + 1 != lVar4);
  return;
}

Assistant:

void LumaQuantizer::setMappingJNDHDRVDP()
{
    const float *mapping;
    switch (m_bitdepth)
    {
    case 10:
        mapping = ptf_jnd_hdrvdp_10bit;
        break;
    case 11:
        mapping = ptf_jnd_hdrvdp_11bit;
        break;
    case 12:
    default:
        mapping = ptf_jnd_hdrvdp_12bit;
        break;
    }
    
    for (size_t i=0; i<=m_maxVal; i++)
        m_mapping[i] = mapping[i];
}